

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execJsr<(moira::Instr)66,(moira::Mode)5,(moira::Size)4>(Moira *this,u16 opcode)

{
  u32 uVar1;
  u32 val;
  AEStackFrame frame;
  bool error;
  
  uVar1 = computeEA<(moira::Mode)5,(moira::Size)4,2ul>(this,opcode & 7);
  (*this->_vptr_Moira[0x19])(this,2);
  if ((uVar1 & 1) == 0) {
    val = (this->reg).pc + 2;
    (this->reg).pc = val;
    push<(moira::Size)4,0ul>(this,val,&error);
    if (error == false) {
      (this->reg).pc = uVar1;
      uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar1);
      (this->queue).irc = (u16)uVar1;
      prefetch<4ul>(this);
    }
    return;
  }
  frame = makeFrame<0ul>(this,uVar1);
  execAddressError(this,frame,0);
  return;
}

Assistant:

void
Moira::execJsr(u16 opcode)
{
    int src = _____________xxx(opcode);
    u32 ea  = computeEA<M, Long, SKIP_LAST_READ>(src);
    
    const int delay[] = { 0,0,0,0,0,2,4,2,0,2,4,0 };
    sync(delay[M]);

    /*
    if (M == 5) {
        int x = (i16)queue.irc;
        printf("JSR $%s%x(a%d) [a%d = %x] ea = %x\n", x<0?"-":"", x<0?-(unsigned)x:x, src, src, reg.a[src], ea);
    }
    */
    
    // Check for address error in displacement modes
    if (isDspMode(M) && misaligned<Word>(ea)) {
        execAddressError(makeFrame(ea));
        return;
    }

    // Update program counter
    if (isAbsMode(M) || isDspMode(M)) reg.pc += 2;

    // Check for address error in all other modes
    if (misaligned<Word>(ea)) {
        execAddressError(makeFrame(ea));
        return;
    }

    // Save return address on stack
    bool error;
    push <Long> (reg.pc, error);
    if (error) return;

    // Jump to new address
    reg.pc = ea;

    queue.irc = readM<MEM_PROG, Word>(ea);
    prefetch<POLLIPL>();
}